

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

void mt_destroy(mtaux_t *mt)

{
  int local_14;
  int i;
  mtaux_t *mt_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&mt->lock);
  mt->done = 1;
  mt->proc_cnt = 0;
  pthread_cond_broadcast((pthread_cond_t *)&mt->cv);
  pthread_mutex_unlock((pthread_mutex_t *)&mt->lock);
  for (local_14 = 1; local_14 < mt->n_threads; local_14 = local_14 + 1) {
    pthread_join(mt->tid[local_14],(void **)0x0);
  }
  for (local_14 = 0; local_14 < mt->n_blks; local_14 = local_14 + 1) {
    free(mt->blk[local_14]);
  }
  for (local_14 = 0; local_14 < mt->n_threads; local_14 = local_14 + 1) {
    free(mt->w[local_14].buf);
  }
  free(mt->blk);
  free(mt->len);
  free(mt->w);
  free(mt->tid);
  pthread_cond_destroy((pthread_cond_t *)&mt->cv);
  pthread_mutex_destroy((pthread_mutex_t *)&mt->lock);
  free(mt);
  return;
}

Assistant:

static void mt_destroy(mtaux_t *mt)
{
    int i;
    // signal all workers to quit
    pthread_mutex_lock(&mt->lock);
    mt->done = 1; mt->proc_cnt = 0;
    pthread_cond_broadcast(&mt->cv);
    pthread_mutex_unlock(&mt->lock);
    for (i = 1; i < mt->n_threads; ++i) pthread_join(mt->tid[i], 0); // worker 0 is effectively launched by the master thread
    // free other data allocated on heap
    for (i = 0; i < mt->n_blks; ++i) free(mt->blk[i]);
    for (i = 0; i < mt->n_threads; ++i) free(mt->w[i].buf);
    free(mt->blk); free(mt->len); free(mt->w); free(mt->tid);
    pthread_cond_destroy(&mt->cv);
    pthread_mutex_destroy(&mt->lock);
    free(mt);
}